

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O0

void predict_or_learn<false>(LRQstate *lrq,single_learner *base,example *ec)

{
  bool bVar1;
  uchar **ppuVar2;
  size_t sVar3;
  byte *pbVar4;
  long lVar5;
  float *pfVar6;
  unsigned_long *puVar7;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this;
  element_type *peVar8;
  ostream *poVar9;
  char *__s;
  undefined1 *puVar10;
  v_array<unsigned_char> *in_RDX;
  long *in_RDI;
  undefined1 uVar11;
  uchar right_1;
  string *i_2;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  uint64_t rwindex;
  uint64_t rindex;
  float rfx;
  uint rfn;
  features *right_fs;
  weight *lw;
  uint64_t lwindex;
  uint n;
  uint64_t lindex;
  float lfx;
  uint lfn;
  features *left_fs;
  uint k;
  uchar right;
  uchar left;
  string *i_1;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  uint iter;
  uint32_t stride_shift;
  float scale;
  bool do_dropout;
  uint maxiter;
  float first_uncertainty;
  float first_loss;
  float first_prediction;
  size_t which;
  namespace_index i;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  vw *all;
  parameters *in_stack_fffffffffffffcd8;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffce0;
  example *in_stack_fffffffffffffce8;
  features *in_stack_fffffffffffffcf0;
  ostream *in_stack_fffffffffffffd08;
  features *in_stack_fffffffffffffd10;
  undefined4 uVar12;
  undefined1 in_stack_fffffffffffffd24;
  undefined1 uVar13;
  undefined1 in_stack_fffffffffffffd27;
  reference in_stack_fffffffffffffd28;
  iterator in_stack_fffffffffffffd30;
  _Self local_2c8;
  long *local_2c0;
  undefined1 local_2a8 [80];
  ostream local_258;
  long local_e0;
  unsigned_long local_d8;
  float local_d0;
  uint local_cc;
  v_array<float> *local_c8;
  weight *local_c0;
  uchar *local_b8;
  uint local_ac;
  uchar *local_a8;
  float local_a0;
  uint local_9c;
  v_array<float> *local_98;
  uint local_90;
  byte local_8a;
  byte local_89;
  reference local_88;
  _Self local_80;
  _Self local_78;
  long *local_70;
  uint local_68;
  uint32_t local_64;
  undefined4 local_60;
  byte local_59;
  uint local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  size_t local_48;
  byte local_39;
  byte *local_38;
  byte *local_30;
  v_array<unsigned_char> *local_28;
  long local_20;
  v_array<unsigned_char> *local_18;
  long *local_8;
  
  local_20 = *in_RDI;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memset(in_RDI + 0x21,0,0x800);
  local_28 = local_18;
  ppuVar2 = v_array<unsigned_char>::begin(local_18);
  local_30 = *ppuVar2;
  ppuVar2 = v_array<unsigned_char>::end(local_28);
  local_38 = *ppuVar2;
  for (; local_30 != local_38; local_30 = local_30 + 1) {
    local_39 = *local_30;
    if ((*(byte *)((long)local_8 + (ulong)local_39 + 8) & 1) != 0) {
      sVar3 = features::size((features *)0x39b8d7);
      local_8[(ulong)local_39 + 0x21] = sVar3;
    }
  }
  local_48 = local_18[0x344].erase_count;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 1;
  uVar13 = 0;
  local_59 = 0;
  uVar11 = (*(byte *)(local_8 + 0x127) & 1) == 0;
  uVar12 = 0x3f800000;
  if (!(bool)uVar11) {
    uVar12 = 0x3f000000;
  }
  local_60 = uVar12;
  local_64 = parameters::stride_shift(in_stack_fffffffffffffcd8);
  for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
    local_70 = local_8 + 0x121;
    local_78._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffcd8);
    local_80._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcd8);
    while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
      local_88 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x39ba9f);
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)local_88);
      local_89 = *pbVar4;
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)local_88);
      local_8a = *pbVar4;
      lVar5 = std::__cxx11::string::c_str();
      local_90 = atoi((char *)(lVar5 + 2));
      local_98 = (v_array<float> *)((long)local_18 + (ulong)local_89 * 0x68 + 0x20);
      for (local_9c = 0; (ulong)local_9c < (ulong)local_8[(ulong)local_89 + 0x21];
          local_9c = local_9c + 1) {
        pfVar6 = v_array<float>::operator[](local_98,(ulong)local_9c);
        local_a0 = *pfVar6;
        puVar7 = v_array<unsigned_long>::operator[]
                           ((v_array<unsigned_long> *)(local_98 + 1),(ulong)local_9c);
        local_a8 = local_18[0x341]._begin + *puVar7;
        for (local_ac = 1; local_ac <= local_90; local_ac = local_ac + 1) {
          if (((local_59 & 1) == 0) || (bVar1 = cheesyrbit((uint64_t *)0x39bbf6), bVar1)) {
            local_b8 = local_a8 + ((ulong)local_ac << ((byte)local_64 & 0x3f));
            local_c0 = parameters::operator[]
                                 ((parameters *)in_stack_fffffffffffffce8,
                                  (size_t)in_stack_fffffffffffffce0);
            local_c8 = (v_array<float> *)((long)local_18 + (ulong)local_8a * 0x68 + 0x20);
            for (local_cc = 0; (ulong)local_cc < (ulong)local_8[(ulong)local_8a + 0x21];
                local_cc = local_cc + 1) {
              pfVar6 = v_array<float>::operator[](local_c8,(ulong)local_cc);
              local_d0 = *pfVar6;
              puVar7 = v_array<unsigned_long>::operator[]
                                 ((v_array<unsigned_long> *)(local_c8 + 1),(ulong)local_cc);
              local_d8 = *puVar7;
              local_e0 = local_d8 + ((ulong)local_ac << ((byte)local_64 & 0x3f));
              features::push_back(in_stack_fffffffffffffcf0,
                                  (feature_value)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                                  (feature_index)in_stack_fffffffffffffce0);
              if (((*(byte *)(local_20 + 0x3438) & 1) != 0) ||
                 ((*(byte *)(local_20 + 0x3618) & 1) != 0)) {
                std::__cxx11::stringstream::stringstream((stringstream *)(local_2a8 + 0x40));
                in_stack_fffffffffffffd10 = (features *)std::operator<<(&local_258,local_8a);
                in_stack_fffffffffffffd08 =
                     std::operator<<((ostream *)in_stack_fffffffffffffd10,'^');
                this = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)(local_c8 + 2),(ulong)local_cc)->
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ;
                peVar8 = std::
                         __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ::get(this);
                poVar9 = std::operator<<(in_stack_fffffffffffffd08,(string *)&peVar8->second);
                poVar9 = std::operator<<(poVar9,'^');
                std::ostream::operator<<(poVar9,local_ac);
                local_2a8._40_8_ = strdup("lrq");
                std::__cxx11::stringstream::str();
                in_stack_fffffffffffffcd8 = (parameters *)local_2a8;
                __s = (char *)std::__cxx11::string::c_str();
                in_stack_fffffffffffffce0 =
                     (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)strdup(__s);
                std::__cxx11::string::~string((string *)in_stack_fffffffffffffcd8);
                in_stack_fffffffffffffce8 = (example *)(local_c8 + 2);
                local_2a8._32_8_ = in_stack_fffffffffffffce0;
                in_stack_fffffffffffffcf0 = (features *)operator_new(0x40);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<char_*&,_char_*&,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffd30._M_node,(char **)in_stack_fffffffffffffd28,
                           (char **)CONCAT17(in_stack_fffffffffffffd27,
                                             CONCAT16(uVar13,CONCAT15(uVar11,CONCAT14(
                                                  in_stack_fffffffffffffd24,uVar12)))));
                std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
                shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                          ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffce0,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffcd8);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(in_stack_fffffffffffffce0,
                            (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffcd8);
                std::
                shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x39bee0);
                std::__cxx11::stringstream::~stringstream((stringstream *)(local_2a8 + 0x40));
              }
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffce0);
    }
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               (size_t)in_stack_fffffffffffffce0);
    if (local_68 == 0) {
      local_4c = *(undefined4 *)&local_18[0x342].end_array;
      local_50 = *(undefined4 *)&local_18[0x345].end_array;
      local_54 = (undefined4)local_18[0x345].erase_count;
    }
    else {
      *(undefined4 *)&local_18[0x342].end_array = local_4c;
      *(undefined4 *)&local_18[0x345].end_array = local_50;
      *(undefined4 *)&local_18[0x345].erase_count = local_54;
    }
    local_2c0 = local_8 + 0x121;
    local_2c8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffd30 =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcd8);
    while (bVar1 = std::operator!=(&local_2c8,(_Self *)&stack0xfffffffffffffd30), bVar1) {
      in_stack_fffffffffffffd28 =
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x39c0be);
      puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd27 = *puVar10;
      features::truncate_to(in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffce0);
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void predict_or_learn(LRQstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  // Remember original features

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices)
  {
    if (lrq.lrindices[i])
      lrq.orig_size[i] = ec.feature_space[i].size();
  }

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  float first_uncertainty = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;

  bool do_dropout = lrq.dropout && is_learn && !example_is_test(ec);
  float scale = (!lrq.dropout || do_dropout) ? 1.f : 0.5f;

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa
    // TODO: what happens with --lrq ab2 --lrq ac2
    //       i.e. namespace occurs multiple times (?)

    for (string const& i : lrq.lrpairs)
    {
      unsigned char left = i[which % 2];
      unsigned char right = i[(which + 1) % 2];
      unsigned int k = atoi(i.c_str() + 2);

      features& left_fs = ec.feature_space[left];
      for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
      {
        float lfx = left_fs.values[lfn];
        uint64_t lindex = left_fs.indicies[lfn] + ec.ft_offset;
        for (unsigned int n = 1; n <= k; ++n)
        {
          if (!do_dropout || cheesyrbit(lrq.seed))
          {
            uint64_t lwindex = (lindex + ((uint64_t)n << stride_shift));
            weight* lw = &lrq.all->weights[lwindex];

            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex);  // not sure if lw needs a weight mask?

            features& right_fs = ec.feature_space[right];
            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              // NB: ec.ft_offset added by base learner
              float rfx = right_fs.values[rfn];
              uint64_t rindex = right_fs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)n << stride_shift));

              right_fs.push_back(scale * *lw * lfx * rfx, rwindex);

              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << right_fs.space_names[rfn].get()->second << '^' << n;

#ifdef _WIN32
                char* new_space = _strdup("lrq");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrq");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                right_fs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
      first_uncertainty = ec.confidence;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
      ec.confidence = first_uncertainty;
    }

    for (string const& i : lrq.lrpairs)
    {
      unsigned char right = i[(which + 1) % 2];
      ec.feature_space[right].truncate_to(lrq.orig_size[right]);
    }
  }
}